

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

string * __thiscall
cmOutputConverter::Convert
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source,
          RelativeRoot relative,OutputFormat output)

{
  pointer pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  cmState *pcVar3;
  string result;
  string local_90;
  undefined1 local_70 [40];
  string local_48;
  
  pcVar1 = (source->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + source->_M_string_length);
  switch(relative) {
  case FULL:
    cmsys::SystemTools::CollapseFullPath((string *)local_70,&local_90);
    break;
  case HOME:
    pcVar3 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pvVar2 = cmState::GetSourceDirectoryComponents_abi_cxx11_(pcVar3);
    ConvertToRelativePath((string *)local_70,this,pvVar2,&local_90,false);
    break;
  case START:
    cmState::Snapshot::GetDirectory((Directory *)local_70,&this->StateSnapshot);
    pvVar2 = cmState::Directory::GetCurrentSourceComponents_abi_cxx11_((Directory *)local_70);
    ConvertToRelativePath(&local_48,this,pvVar2,&local_90,false);
    goto LAB_0033decb;
  case HOME_OUTPUT:
    pcVar3 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pvVar2 = cmState::GetBinaryDirectoryComponents_abi_cxx11_(pcVar3);
    ConvertToRelativePath((string *)local_70,this,pvVar2,&local_90,false);
    break;
  case START_OUTPUT:
    cmState::Snapshot::GetDirectory((Directory *)local_70,&this->StateSnapshot);
    pvVar2 = cmState::Directory::GetCurrentBinaryComponents_abi_cxx11_((Directory *)local_70);
    ConvertToRelativePath(&local_48,this,pvVar2,&local_90,false);
LAB_0033decb:
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto switchD_0033de55_default;
    goto LAB_0033df6b;
  default:
    goto switchD_0033de55_default;
  }
  std::__cxx11::string::operator=((string *)&local_90,(string *)local_70);
  local_48.field_2._M_allocated_capacity = local_70._16_8_;
  local_48._M_dataplus._M_p = (pointer)local_70._0_8_;
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
LAB_0033df6b:
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
switchD_0033de55_default:
  ConvertToOutputFormat(__return_storage_ptr__,this,&local_90,output);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::Convert(const std::string& source,
                                       RelativeRoot relative,
                                       OutputFormat output) const
{
  // Convert the path to a relative path.
  std::string result = source;

  switch (relative)
    {
  case HOME:
    result = this->ConvertToRelativePath(
          this->GetState()->GetSourceDirectoryComponents(), result);
    break;
  case START:
    result = this->ConvertToRelativePath(
          this->StateSnapshot.GetDirectory().GetCurrentSourceComponents(),
          result);
    break;
  case HOME_OUTPUT:
    result = this->ConvertToRelativePath(
          this->GetState()->GetBinaryDirectoryComponents(), result);
    break;
  case START_OUTPUT:
    result = this->ConvertToRelativePath(
          this->StateSnapshot.GetDirectory().GetCurrentBinaryComponents(),
          result);
    break;
  case FULL:
    result = cmSystemTools::CollapseFullPath(result);
    break;
  case NONE:
    break;
    }
  return this->ConvertToOutputFormat(result, output);
}